

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O1

void __thiscall Sequence::read_files(Sequence *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  element_type *peVar2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  Array *pAVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  int maxitemsup;
  undefined1 local_4d;
  int local_4c;
  Array *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  fVar16 = ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           avg_trans_count * 30.0;
  uVar12 = (ulong)fVar16;
  this_00 = (this->numLargeItemset).
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,(long)(fVar16 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12);
  iVar10 = InvertDatabase::make_l1_pass
                     ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  peVar2 = (this->numLargeItemset).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar3 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish == piVar3) {
    uVar13 = 0;
    uVar12 = 0;
  }
  else {
    *piVar3 = iVar10;
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        ext_l2_pass == 0) {
      iVar10 = get_file_l2(this);
    }
    else {
      iVar10 = InvertDatabase::make_l2_pass
                         ((this->invdb).
                          super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    peVar2 = (this->numLargeItemset).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    piVar1 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar12 = (long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    if (1 < uVar12) {
      piVar1[1] = iVar10;
      if (0 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              dbase_max_item) {
        lVar15 = 0;
        lVar14 = 0;
        do {
          plVar4 = *(long **)((long)&((((this->invdb).
                                        super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->eqgraph).
                                      super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> +
                             lVar15);
          if (plVar4 != (long *)0x0) {
            puVar5 = (undefined8 *)*plVar4;
            if ((puVar5 != (undefined8 *)0x0) && (0 < *(int *)(puVar5 + 2))) {
              p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)*puVar5,(long)*(int *)(puVar5 + 2));
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
            }
            lVar7 = *(long *)((long)&((((this->invdb).
                                        super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->eqgraph).
                                      super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> +
                             lVar15);
            puVar5 = *(undefined8 **)(lVar7 + 0x10);
            if ((puVar5 != (undefined8 *)0x0) && (0 < *(int *)(puVar5 + 2))) {
              p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar7 + 0x18);
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)*puVar5,(long)*(int *)(puVar5 + 2));
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
            }
          }
          lVar14 = lVar14 + 1;
          lVar15 = lVar15 + 0x10;
        } while (lVar14 < ((this->args).
                           super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          dbase_max_item);
      }
      local_4c = 0;
      if (0 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              dbase_max_item) {
        iVar10 = 0;
        do {
          iVar11 = Partition::partition_get_idxsup
                             ((this->partition).
                              super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              iVar10);
          if (local_4c < iVar11) {
            local_4c = iVar11;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < ((this->args).
                           super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          dbase_max_item);
      }
      local_48 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Array,std::allocator<Array>,int&>
                (a_Stack_40,&local_48,(allocator<Array> *)&local_4d,&local_4c);
      _Var9._M_pi = a_Stack_40[0]._M_pi;
      pAVar8 = local_48;
      local_48 = (Array *)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (this->l_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->l_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar8;
      (this->l_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var9._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      }
      local_48 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Array,std::allocator<Array>,int&>
                (a_Stack_40,&local_48,(allocator<Array> *)&local_4d,&local_4c);
      _Var9._M_pi = a_Stack_40[0]._M_pi;
      pAVar8 = local_48;
      local_48 = (Array *)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (this->e_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->e_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar8;
      (this->e_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var9._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      }
      local_48 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Array,std::allocator<Array>,int&>
                (a_Stack_40,&local_48,(allocator<Array> *)&local_4d,&local_4c);
      _Var9._M_pi = a_Stack_40[0]._M_pi;
      pAVar8 = local_48;
      local_48 = (Array *)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (this->m_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->m_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar8;
      (this->m_array).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var9._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      }
      return;
    }
    uVar13 = 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar12);
}

Assistant:

void Sequence::read_files() {
    int i;
    auto capacity = static_cast<unsigned long>(args->avg_trans_count * 30);

    numLargeItemset->clear();
    numLargeItemset->resize(capacity);

    numLargeItemset->at(0) = invdb->make_l1_pass();

    if (args->ext_l2_pass) {
        numLargeItemset->at(1) = invdb->make_l2_pass();
    } else {
        numLargeItemset->at(1) = get_file_l2();
    }

    for (i = 0; i < args->dbase_max_item; i++) {
        if (invdb->get_eqgraph_item(i)) {
            if (invdb->get_eqgraph_item(i)->num_elements() > 0)
                invdb->get_eqgraph_item(i)->elements()->compact();
            if (invdb->get_eqgraph_item(i)->seqnum_elements() > 0)
                invdb->get_eqgraph_item(i)->seqelements()->compact();
        }
    }

    int maxitemsup = 0;
    int sup;
    for (i = 0; i < args->dbase_max_item; i++) {
        sup = partition->partition_get_idxsup(i);
        if (maxitemsup < sup) maxitemsup = sup;
    }
    l_array = make_shared<Array>(maxitemsup);
    e_array = make_shared<Array>(maxitemsup);
    m_array = make_shared<Array>(maxitemsup);
}